

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_astore_1(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value variableValue;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  variableValue = Frame::popTopOfOperandStack(this_01);
  if (variableValue.type == REFERENCE) {
    Frame::changeLocalVariable(this_01,variableValue,1);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value.type == ValueType::REFERENCE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x5e5,"void ExecutionEngine::i_astore_1()");
}

Assistant:

void ExecutionEngine::i_astore_1() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value = topFrame->popTopOfOperandStack();
    assert(value.type == ValueType::REFERENCE);
    topFrame->changeLocalVariable(value, 1);

    topFrame->pc += 1;
}